

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O2

void __thiscall
slang::ast::ReplicatedAssignmentPatternExpression::visitExprs<slang::ast::CheckerMemberVisitor&>
          (ReplicatedAssignmentPatternExpression *this,CheckerMemberVisitor *visitor)

{
  Expression::visit<slang::ast::CheckerMemberVisitor&>(this->count_,visitor);
  AssignmentPatternExpressionBase::visitExprs<slang::ast::CheckerMemberVisitor&>
            (&this->super_AssignmentPatternExpressionBase,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        count().visit(visitor);
        AssignmentPatternExpressionBase::visitExprs(visitor);
    }